

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O2

void __thiscall
btHashMap<btHashKey<btTriIndex>,_btTriIndex>::insert
          (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this,btHashKey<btTriIndex> *key,
          btTriIndex *value)

{
  btTriIndex *pbVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  btCollisionShape *pbVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  
  uVar7 = btHashKey<btTriIndex>::getHash(key);
  iVar2 = (this->m_valueArray).m_capacity;
  iVar8 = findIndex(this,key);
  if (iVar8 == -1) {
    iVar8 = (this->m_valueArray).m_size;
    iVar3 = (this->m_valueArray).m_capacity;
    btAlignedObjectArray<btTriIndex>::push_back(&this->m_valueArray,value);
    btAlignedObjectArray<btHashKey<btTriIndex>_>::push_back(&this->m_keyArray,key);
    if (iVar3 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar7 = btHashKey<btTriIndex>::getHash(key);
      uVar7 = (this->m_valueArray).m_capacity - 1U & uVar7;
    }
    else {
      uVar7 = iVar2 - 1U & uVar7;
    }
    piVar4 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar8] = piVar4[(int)uVar7];
    piVar4[(int)uVar7] = iVar8;
  }
  else {
    uVar6 = *(undefined4 *)&value->field_0x4;
    pbVar5 = value->m_childShape;
    pbVar1 = (this->m_valueArray).m_data + iVar8;
    pbVar1->m_PartIdTriangleIndex = value->m_PartIdTriangleIndex;
    *(undefined4 *)&pbVar1->field_0x4 = uVar6;
    pbVar1->m_childShape = pbVar5;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}